

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O1

void __thiscall
TEST_MockComparatorCopierTest_customObjectWithFunctionComparator_Test::testBody
          (TEST_MockComparatorCopierTest_customObjectWithFunctionComparator_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MyTypeForTesting object;
  MockFunctionComparator comparator;
  SimpleString SStack_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48;
  undefined **local_38;
  undefined8 *local_30;
  undefined **local_28;
  code *local_20;
  code *local_18;
  
  local_38 = &PTR__MyTypeForTesting_002b3450;
  local_30 = (undefined8 *)
             operator_new(8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                          ,0x2e);
  *local_30 = 1;
  local_28 = &PTR__MockNamedValueComparator_002b3930;
  local_20 = myTypeIsEqual;
  local_18 = myTypeValueToString;
  SimpleString::SimpleString(&SStack_78,"");
  pMVar2 = mock(&SStack_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_68,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2c])(pMVar2,&local_68,&local_28);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&SStack_78);
  SimpleString::SimpleString(&SStack_78,"");
  pMVar2 = mock(&SStack_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_68,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_68);
  SimpleString::SimpleString(&local_48,"MyTypeForTesting");
  SimpleString::SimpleString(&local_58,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar1),&local_48,&local_58,&local_38);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&SStack_78);
  SimpleString::SimpleString(&SStack_78,"");
  pMVar2 = mock(&SStack_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_68,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_68);
  SimpleString::SimpleString(&local_48,"MyTypeForTesting");
  SimpleString::SimpleString(&local_58,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x20))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_48,&local_58,&local_38);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&SStack_78);
  SimpleString::SimpleString(&SStack_78,"");
  pMVar2 = mock(&SStack_78,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&SStack_78);
  SimpleString::SimpleString(&SStack_78,"");
  pMVar2 = mock(&SStack_78,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&SStack_78);
  local_38 = &PTR__MyTypeForTesting_002b3450;
  if (local_30 != (undefined8 *)0x0) {
    operator_delete(local_30,8);
  }
  return;
}

Assistant:

MyTypeForTesting(long val)
    {
        value = new long(val);
    }